

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Lexer::Execute(Lexer *this)

{
  uchar c_00;
  bool bVar1;
  reference pvVar2;
  uchar c;
  Lexer *this_local;
  
  this->m_current = this->m_start;
LAB_0013f02c:
  do {
    bVar1 = IsEndOfText(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0013f34f:
      bVar1 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::empty
                        (&this->m_symbolList);
      if ((!bVar1) &&
         (pvVar2 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::back
                             (&this->m_symbolList), pvVar2->type != NewLine)) {
        CreateSymbol(this,NewLine);
      }
      return (bool)((this->m_error ^ 0xffU) & 1);
    }
    ParseWhitespace(this);
    bVar1 = IsNewline(this,*this->m_current);
    if (!bVar1) {
      bVar1 = IsEndOfText(this);
      if (bVar1) goto LAB_0013f34f;
      c_00 = *this->m_current;
      switch(c_00) {
      case '!':
        bVar1 = IsNextCharacter(this,'=');
        if (bVar1) {
          CreateSymbol(this,NotEquals);
          AdvanceCurrent(this);
        }
        else {
          Error<>(this,"Invalid symbol \'!\'");
        }
        break;
      case '\"':
        ParseString(this);
        break;
      default:
        if ((c_00 == '.') && (bVar1 = IsNextCharacter(this,'.'), bVar1)) {
          ParseEllipse(this);
        }
        else {
          bVar1 = IsNumberStart(this,c_00);
          if (bVar1) {
            ParseNumber(this);
          }
          else {
            ParseName(this);
          }
        }
        goto LAB_0013f02c;
      case '%':
        CreateSymbol(this,Percent);
        break;
      case '(':
        CreateSymbol(this,ParenOpen);
        break;
      case ')':
        CreateSymbol(this,ParenClose);
        break;
      case '*':
        CreateSymbol(this,Asterisk);
        break;
      case '+':
        bVar1 = IsNextDigit(this);
        if (bVar1) {
          AdvanceCurrent(this);
          ParseNumber(this);
          goto LAB_0013f02c;
        }
        CreateSymbol(this,Plus);
        break;
      case ',':
        CreateSymbol(this,Comma);
        break;
      case '-':
        bVar1 = IsNextCharacter(this,'-');
        if (bVar1) {
          ParseComment(this);
          goto LAB_0013f02c;
        }
        bVar1 = IsNextDigit(this);
        if (bVar1) {
          ParseNumber(this);
          goto LAB_0013f02c;
        }
        CreateSymbol(this,Minus);
        break;
      case '/':
        CreateSymbol(this,ForwardSlash);
        break;
      case '<':
        bVar1 = IsNextCharacter(this,'=');
        if (bVar1) {
          CreateSymbol(this,LessThanEquals);
          AdvanceCurrent(this);
        }
        else {
          CreateSymbol(this,LessThan);
        }
        break;
      case '=':
        CreateSymbol(this,Equals);
        break;
      case '>':
        bVar1 = IsNextCharacter(this,'=');
        if (bVar1) {
          CreateSymbol(this,GreaterThanEquals);
          AdvanceCurrent(this);
        }
        else {
          CreateSymbol(this,GreaterThan);
        }
        break;
      case '[':
        CreateSymbol(this,SquareOpen);
        break;
      case ']':
        CreateSymbol(this,SquareClose);
        break;
      case '{':
        CreateSymbol(this,CurlyOpen);
        break;
      case '}':
        CreateSymbol(this,CurlyClose);
      }
      if ((this->m_error & 1U) != 0) goto LAB_0013f34f;
      AdvanceCurrent(this);
      goto LAB_0013f02c;
    }
    ParseEndOfLine(this);
  } while( true );
}

Assistant:

inline_t bool Lexer::Execute()
	{
		m_current = m_start;

		// Create a list of tokens for the parser to analyze
		while (!IsEndOfText())
		{
			// Advance past any whitespace
			ParseWhitespace();

			// Check for end of line character
			if (IsNewline(*m_current))
			{
				// Advance past end of line
				ParseEndOfLine();
				continue;
			}

			// May have reached end of text after parsing whitespace or end of line
			if (IsEndOfText())
				break;

			// Check for operators first
			unsigned char c = *m_current;
			switch (c)
			{
			case '-':
				if (IsNextCharacter('-'))
				{
					ParseComment();
					continue;
				}
				else if (IsNextDigit())
				{
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Minus);
				break;
			case '<':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::LessThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::LessThan);
				}
				break;
			case '>':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::GreaterThanEquals);
					AdvanceCurrent();
				}
				else
				{
					CreateSymbol(SymbolType::GreaterThan);
				}
				break;
			case '"':
				ParseString();
				break;
			case '*':
				CreateSymbol(SymbolType::Asterisk);
				break;
			case '/':
				CreateSymbol(SymbolType::ForwardSlash);
				break;
			case '+':
				if (IsNextDigit())
				{
					AdvanceCurrent();
					ParseNumber();
					continue;
				}
				else
					CreateSymbol(SymbolType::Plus);
				break;
			case '=':
				CreateSymbol(SymbolType::Equals);
				break;
			case '!':
				if (IsNextCharacter('='))
				{
					CreateSymbol(SymbolType::NotEquals);
					AdvanceCurrent();
				}
				else
				{
					Error("Invalid symbol '!'");
					break;
				}
				break;
			case '%':
				CreateSymbol(SymbolType::Percent);
				break;
			case ',':
				CreateSymbol(SymbolType::Comma);
				break;
			case '(':
				CreateSymbol(SymbolType::ParenOpen);
				break;
			case ')':
				CreateSymbol(SymbolType::ParenClose);
				break;
			case '{':
				CreateSymbol(SymbolType::CurlyOpen);
				break;
			case '}':
				CreateSymbol(SymbolType::CurlyClose);
				break;
			case '[':
				CreateSymbol(SymbolType::SquareOpen);
				break;
			case ']':
				CreateSymbol(SymbolType::SquareClose);
				break;
			default:
			{
				if (c == '.' && IsNextCharacter('.'))
					ParseEllipse();
				else
				{
					if (IsNumberStart(c))
						ParseNumber();
					else
						ParseName();
				}
				continue;
			}
			};

			// Check for errors
			if (m_error)
				break;

			// Advance one UTF-8 character
			AdvanceCurrent();
		}

		// Make sure programs always end with a new line marker for parsing consistency
		if (!m_symbolList.empty() && m_symbolList.back().type != SymbolType::NewLine)
			CreateSymbol(SymbolType::NewLine);

		// Return error status
		return !m_error;
	}